

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::printFloatDeclaration
               (ostringstream *oss,string *varName,bool uniform,GLfloat value)

{
  ostream *poVar1;
  int precision;
  undefined7 in_register_00000011;
  VarType varType;
  string local_b0;
  Layout local_8c;
  VariableDeclaration local_78;
  
  glu::VarType::VarType(&varType,TYPE_FLOAT,PRECISION_HIGHP);
  if ((int)CONCAT71(in_register_00000011,uniform) == 0) {
    glu::Layout::Layout(&local_8c,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_78,&varType,varName,STORAGE_CONST,INTERPOLATION_LAST,&local_8c,0);
    poVar1 = glu::operator<<((ostream *)oss,&local_78);
    poVar1 = std::operator<<(poVar1," = ");
    de::floatToString_abi_cxx11_(&local_b0,(de *)0x6,value,precision);
    poVar1 = std::operator<<(poVar1,(string *)&local_b0);
    std::operator<<(poVar1,";\n");
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    glu::Layout::Layout((Layout *)&local_b0,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_78,&varType,varName,STORAGE_UNIFORM,INTERPOLATION_LAST,(Layout *)&local_b0,0);
    poVar1 = glu::operator<<((ostream *)oss,&local_78);
    std::operator<<(poVar1,";\n");
  }
  glu::VariableDeclaration::~VariableDeclaration(&local_78);
  glu::VarType::~VarType(&varType);
  return;
}

Assistant:

void printFloatDeclaration (ostringstream&	oss,
							const string&	varName,
							bool			uniform,
							GLfloat			value		= 0.0)
{
	using namespace glu;

	const VarType	varType	(TYPE_FLOAT, PRECISION_HIGHP);

	if (uniform)
		oss << VariableDeclaration(varType, varName, STORAGE_UNIFORM) << ";\n";
	else
		oss << VariableDeclaration(varType, varName, STORAGE_CONST)
			<< " = " << de::floatToString(value, 6) << ";\n";
}